

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-x86.c
# Opt level: O0

void sha1_process_x86(uint32_t *state,uint8_t *data,uint32_t length)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint in_EDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i ABCD_SAVE;
  __m128i ABCD;
  ulong local_a78;
  ulong uStack_a70;
  ulong local_a68;
  ulong uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  ulong local_a48;
  ulong uStack_a40;
  undefined1 local_a18 [16];
  undefined1 local_9f8 [16];
  uint local_9dc;
  undefined1 (*local_9d8) [16];
  __m128i MASK;
  __m128i MSG3;
  __m128i MSG2;
  __m128i MSG1;
  __m128i MSG0;
  __m128i E1;
  __m128i E0_SAVE;
  __m128i E0;
  
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x8090a0b0c0d0e0f),ZEXT816(0x1020304050607));
  auVar16 = vpinsrd_avx(ZEXT416(0),0,1);
  auVar16 = vpinsrd_avx(auVar16,0,2);
  local_a18 = vpinsrd_avx(auVar16,*(undefined4 *)in_RDI[1],3);
  local_9f8 = vpshufd_avx(*in_RDI,0x1b);
  local_9d8 = in_RSI;
  for (local_9dc = in_EDX; 0x3f < local_9dc; local_9dc = local_9dc - 0x40) {
    auVar15 = vpshufb_avx(*local_9d8,auVar1);
    auVar16 = vpaddd_avx(local_a18,auVar15);
    auVar11 = sha1rnds4_sha(local_9f8,auVar16,0);
    auVar16 = vpshufb_avx(local_9d8[1],auVar1);
    auVar12 = sha1nexte_sha(local_9f8,auVar16);
    auVar12 = sha1rnds4_sha(auVar11,auVar12,0);
    auVar13 = sha1msg1_sha(auVar15,auVar16);
    auVar15 = vpshufb_avx(local_9d8[2],auVar1);
    local_a68 = auVar15._0_8_;
    uStack_a60 = auVar15._8_8_;
    auVar11 = sha1nexte_sha(auVar11,auVar15);
    auVar11 = sha1rnds4_sha(auVar12,auVar11,0);
    auVar14 = sha1msg1_sha(auVar16,auVar15);
    local_a48 = auVar13._0_8_;
    uStack_a40 = auVar13._8_8_;
    auVar16 = vpshufb_avx(local_9d8[3],auVar1);
    local_a78 = auVar16._0_8_;
    uStack_a70 = auVar16._8_8_;
    auVar12 = sha1nexte_sha(auVar12,auVar16);
    auVar10._8_8_ = uStack_a40 ^ uStack_a60;
    auVar10._0_8_ = local_a48 ^ local_a68;
    auVar13 = sha1msg2_sha(auVar10,auVar16);
    auVar12 = sha1rnds4_sha(auVar11,auVar12,0);
    auVar15 = sha1msg1_sha(auVar15,auVar16);
    local_a58 = auVar14._0_8_;
    uStack_a50 = auVar14._8_8_;
    local_a48 = auVar13._0_8_;
    uStack_a40 = auVar13._8_8_;
    auVar11 = sha1nexte_sha(auVar11,auVar13);
    auVar9._8_8_ = uStack_a50 ^ uStack_a70;
    auVar9._0_8_ = local_a58 ^ local_a78;
    auVar14 = sha1msg2_sha(auVar9,auVar13);
    auVar11 = sha1rnds4_sha(auVar12,auVar11,0);
    auVar16 = sha1msg1_sha(auVar16,auVar13);
    local_a68 = auVar15._0_8_;
    uStack_a60 = auVar15._8_8_;
    local_a58 = auVar14._0_8_;
    uStack_a50 = auVar14._8_8_;
    auVar15 = sha1nexte_sha(auVar12,auVar14);
    auVar8._8_8_ = uStack_a60 ^ uStack_a40;
    auVar8._0_8_ = local_a68 ^ local_a48;
    auVar12 = sha1msg2_sha(auVar8,auVar14);
    auVar15 = sha1rnds4_sha(auVar11,auVar15,1);
    auVar13 = sha1msg1_sha(auVar13,auVar14);
    local_a78 = auVar16._0_8_;
    uStack_a70 = auVar16._8_8_;
    local_a68 = auVar12._0_8_;
    uStack_a60 = auVar12._8_8_;
    auVar16 = sha1nexte_sha(auVar11,auVar12);
    auVar7._8_8_ = uStack_a70 ^ uStack_a50;
    auVar7._0_8_ = local_a78 ^ local_a58;
    auVar11 = sha1msg2_sha(auVar7,auVar12);
    auVar16 = sha1rnds4_sha(auVar15,auVar16,1);
    auVar14 = sha1msg1_sha(auVar14,auVar12);
    local_a48 = auVar13._0_8_;
    uStack_a40 = auVar13._8_8_;
    local_a78 = auVar11._0_8_;
    uStack_a70 = auVar11._8_8_;
    auVar15 = sha1nexte_sha(auVar15,auVar11);
    auVar6._8_8_ = uStack_a40 ^ uStack_a60;
    auVar6._0_8_ = local_a48 ^ local_a68;
    auVar13 = sha1msg2_sha(auVar6,auVar11);
    auVar15 = sha1rnds4_sha(auVar16,auVar15,1);
    auVar12 = sha1msg1_sha(auVar12,auVar11);
    local_a58 = auVar14._0_8_;
    uStack_a50 = auVar14._8_8_;
    local_a48 = auVar13._0_8_;
    uStack_a40 = auVar13._8_8_;
    auVar16 = sha1nexte_sha(auVar16,auVar13);
    auVar5._8_8_ = uStack_a50 ^ uStack_a70;
    auVar5._0_8_ = local_a58 ^ local_a78;
    auVar14 = sha1msg2_sha(auVar5,auVar13);
    auVar16 = sha1rnds4_sha(auVar15,auVar16,1);
    auVar11 = sha1msg1_sha(auVar11,auVar13);
    local_a68 = auVar12._0_8_;
    uStack_a60 = auVar12._8_8_;
    local_a58 = auVar14._0_8_;
    uStack_a50 = auVar14._8_8_;
    auVar15 = sha1nexte_sha(auVar15,auVar14);
    auVar4._8_8_ = uStack_a60 ^ uStack_a40;
    auVar4._0_8_ = local_a68 ^ local_a48;
    auVar12 = sha1msg2_sha(auVar4,auVar14);
    auVar15 = sha1rnds4_sha(auVar16,auVar15,1);
    auVar13 = sha1msg1_sha(auVar13,auVar14);
    local_a78 = auVar11._0_8_;
    uStack_a70 = auVar11._8_8_;
    local_a68 = auVar12._0_8_;
    uStack_a60 = auVar12._8_8_;
    auVar16 = sha1nexte_sha(auVar16,auVar12);
    auVar3._8_8_ = uStack_a70 ^ uStack_a50;
    auVar3._0_8_ = local_a78 ^ local_a58;
    auVar11 = sha1msg2_sha(auVar3,auVar12);
    auVar16 = sha1rnds4_sha(auVar15,auVar16,2);
    auVar14 = sha1msg1_sha(auVar14,auVar12);
    local_a48 = auVar13._0_8_;
    uStack_a40 = auVar13._8_8_;
    local_a78 = auVar11._0_8_;
    uStack_a70 = auVar11._8_8_;
    auVar15 = sha1nexte_sha(auVar15,auVar11);
    auVar2._8_8_ = uStack_a40 ^ uStack_a60;
    auVar2._0_8_ = local_a48 ^ local_a68;
    auVar13 = sha1msg2_sha(auVar2,auVar11);
    auVar15 = sha1rnds4_sha(auVar16,auVar15,2);
    auVar12 = sha1msg1_sha(auVar12,auVar11);
    local_a58 = auVar14._0_8_;
    uStack_a50 = auVar14._8_8_;
    local_a48 = auVar13._0_8_;
    uStack_a40 = auVar13._8_8_;
    auVar16 = sha1nexte_sha(auVar16,auVar13);
    auVar17._8_8_ = uStack_a50 ^ uStack_a70;
    auVar17._0_8_ = local_a58 ^ local_a78;
    auVar17 = sha1msg2_sha(auVar17,auVar13);
    auVar16 = sha1rnds4_sha(auVar15,auVar16,2);
    auVar11 = sha1msg1_sha(auVar11,auVar13);
    local_a68 = auVar12._0_8_;
    uStack_a60 = auVar12._8_8_;
    local_a58 = auVar17._0_8_;
    uStack_a50 = auVar17._8_8_;
    auVar15 = sha1nexte_sha(auVar15,auVar17);
    auVar14._8_8_ = uStack_a60 ^ uStack_a40;
    auVar14._0_8_ = local_a68 ^ local_a48;
    auVar14 = sha1msg2_sha(auVar14,auVar17);
    auVar15 = sha1rnds4_sha(auVar16,auVar15,2);
    auVar12 = sha1msg1_sha(auVar13,auVar17);
    local_a78 = auVar11._0_8_;
    uStack_a70 = auVar11._8_8_;
    local_a68 = auVar14._0_8_;
    uStack_a60 = auVar14._8_8_;
    auVar16 = sha1nexte_sha(auVar16,auVar14);
    auVar13._8_8_ = uStack_a70 ^ uStack_a50;
    auVar13._0_8_ = local_a78 ^ local_a58;
    auVar13 = sha1msg2_sha(auVar13,auVar14);
    auVar16 = sha1rnds4_sha(auVar15,auVar16,2);
    auVar11 = sha1msg1_sha(auVar17,auVar14);
    local_a48 = auVar12._0_8_;
    uStack_a40 = auVar12._8_8_;
    local_a78 = auVar13._0_8_;
    uStack_a70 = auVar13._8_8_;
    auVar15 = sha1nexte_sha(auVar15,auVar13);
    auVar12._8_8_ = uStack_a40 ^ uStack_a60;
    auVar12._0_8_ = local_a48 ^ local_a68;
    auVar12 = sha1msg2_sha(auVar12,auVar13);
    auVar15 = sha1rnds4_sha(auVar16,auVar15,3);
    auVar14 = sha1msg1_sha(auVar14,auVar13);
    local_a58 = auVar11._0_8_;
    uStack_a50 = auVar11._8_8_;
    local_a48 = auVar12._0_8_;
    uStack_a40 = auVar12._8_8_;
    auVar16 = sha1nexte_sha(auVar16,auVar12);
    auVar11._8_8_ = uStack_a50 ^ uStack_a70;
    auVar11._0_8_ = local_a58 ^ local_a78;
    auVar11 = sha1msg2_sha(auVar11,auVar12);
    auVar16 = sha1rnds4_sha(auVar15,auVar16,3);
    auVar12 = sha1msg1_sha(auVar13,auVar12);
    local_a68 = auVar14._0_8_;
    uStack_a60 = auVar14._8_8_;
    local_a58 = auVar11._0_8_;
    uStack_a50 = auVar11._8_8_;
    auVar13 = sha1nexte_sha(auVar15,auVar11);
    auVar15._8_8_ = uStack_a60 ^ uStack_a40;
    auVar15._0_8_ = local_a68 ^ local_a48;
    auVar15 = sha1msg2_sha(auVar15,auVar11);
    auVar11 = sha1rnds4_sha(auVar16,auVar13,3);
    local_a78 = auVar12._0_8_;
    uStack_a70 = auVar12._8_8_;
    auVar12 = sha1nexte_sha(auVar16,auVar15);
    auVar16._8_8_ = uStack_a70 ^ uStack_a50;
    auVar16._0_8_ = local_a78 ^ local_a58;
    auVar16 = sha1msg2_sha(auVar16,auVar15);
    auVar15 = sha1rnds4_sha(auVar11,auVar12,3);
    auVar16 = sha1nexte_sha(auVar11,auVar16);
    auVar16 = sha1rnds4_sha(auVar15,auVar16,3);
    local_a18 = sha1nexte_sha(auVar15,local_a18);
    local_9f8 = vpaddd_avx(auVar16,local_9f8);
    local_9d8 = local_9d8 + 4;
  }
  auVar16 = vpshufd_avx(local_9f8,0x1b);
  local_9f8._0_8_ = auVar16._0_8_;
  local_9f8._8_8_ = auVar16._8_8_;
  *(undefined8 *)*in_RDI = local_9f8._0_8_;
  *(undefined8 *)(*in_RDI + 8) = local_9f8._8_8_;
  *(undefined4 *)in_RDI[1] = local_a18._12_4_;
  return;
}

Assistant:

void sha1_process_x86(uint32_t state[5], const uint8_t data[], uint32_t length)
{
    __m128i ABCD, ABCD_SAVE, E0, E0_SAVE, E1;
    __m128i MSG0, MSG1, MSG2, MSG3;
    const __m128i MASK = _mm_set_epi64x(0x0001020304050607ULL, 0x08090a0b0c0d0e0fULL);

    /* Load initial values */
    ABCD = _mm_loadu_si128((const __m128i*) state);
    E0 = _mm_set_epi32(state[4], 0, 0, 0);
    ABCD = _mm_shuffle_epi32(ABCD, 0x1B);

    while (length >= 64)
    {
        /* Save current state  */
        ABCD_SAVE = ABCD;
        E0_SAVE = E0;

        /* Rounds 0-3 */
        MSG0 = _mm_loadu_si128((const __m128i*)(data + 0));
        MSG0 = _mm_shuffle_epi8(MSG0, MASK);
        E0 = _mm_add_epi32(E0, MSG0);
        E1 = ABCD;
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 0);

        /* Rounds 4-7 */
        MSG1 = _mm_loadu_si128((const __m128i*)(data + 16));
        MSG1 = _mm_shuffle_epi8(MSG1, MASK);
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 0);
        MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);

        /* Rounds 8-11 */
        MSG2 = _mm_loadu_si128((const __m128i*)(data + 32));
        MSG2 = _mm_shuffle_epi8(MSG2, MASK);
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 0);
        MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
        MSG0 = _mm_xor_si128(MSG0, MSG2);

        /* Rounds 12-15 */
        MSG3 = _mm_loadu_si128((const __m128i*)(data + 48));
        MSG3 = _mm_shuffle_epi8(MSG3, MASK);
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 0);
        MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
        MSG1 = _mm_xor_si128(MSG1, MSG3);

        /* Rounds 16-19 */
        E0 = _mm_sha1nexte_epu32(E0, MSG0);
        E1 = ABCD;
        MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 0);
        MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
        MSG2 = _mm_xor_si128(MSG2, MSG0);

        /* Rounds 20-23 */
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 1);
        MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);
        MSG3 = _mm_xor_si128(MSG3, MSG1);

        /* Rounds 24-27 */
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 1);
        MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
        MSG0 = _mm_xor_si128(MSG0, MSG2);

        /* Rounds 28-31 */
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 1);
        MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
        MSG1 = _mm_xor_si128(MSG1, MSG3);

        /* Rounds 32-35 */
        E0 = _mm_sha1nexte_epu32(E0, MSG0);
        E1 = ABCD;
        MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 1);
        MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
        MSG2 = _mm_xor_si128(MSG2, MSG0);

        /* Rounds 36-39 */
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 1);
        MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);
        MSG3 = _mm_xor_si128(MSG3, MSG1);

        /* Rounds 40-43 */
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 2);
        MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
        MSG0 = _mm_xor_si128(MSG0, MSG2);

        /* Rounds 44-47 */
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 2);
        MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
        MSG1 = _mm_xor_si128(MSG1, MSG3);

        /* Rounds 48-51 */
        E0 = _mm_sha1nexte_epu32(E0, MSG0);
        E1 = ABCD;
        MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 2);
        MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
        MSG2 = _mm_xor_si128(MSG2, MSG0);

        /* Rounds 52-55 */
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 2);
        MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);
        MSG3 = _mm_xor_si128(MSG3, MSG1);

        /* Rounds 56-59 */
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 2);
        MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
        MSG0 = _mm_xor_si128(MSG0, MSG2);

        /* Rounds 60-63 */
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 3);
        MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
        MSG1 = _mm_xor_si128(MSG1, MSG3);

        /* Rounds 64-67 */
        E0 = _mm_sha1nexte_epu32(E0, MSG0);
        E1 = ABCD;
        MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 3);
        MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
        MSG2 = _mm_xor_si128(MSG2, MSG0);

        /* Rounds 68-71 */
        E1 = _mm_sha1nexte_epu32(E1, MSG1);
        E0 = ABCD;
        MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 3);
        MSG3 = _mm_xor_si128(MSG3, MSG1);

        /* Rounds 72-75 */
        E0 = _mm_sha1nexte_epu32(E0, MSG2);
        E1 = ABCD;
        MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
        ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 3);

        /* Rounds 76-79 */
        E1 = _mm_sha1nexte_epu32(E1, MSG3);
        E0 = ABCD;
        ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 3);

        /* Combine state */
        E0 = _mm_sha1nexte_epu32(E0, E0_SAVE);
        ABCD = _mm_add_epi32(ABCD, ABCD_SAVE);

        data += 64;
        length -= 64;
    }

    /* Save state */
    ABCD = _mm_shuffle_epi32(ABCD, 0x1B);
    _mm_storeu_si128((__m128i*) state, ABCD);
    state[4] = _mm_extract_epi32(E0, 3);
}